

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O0

int __thiscall CLPIParser::compose(CLPIParser *this,uint8_t *buffer,int bufferSize)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint32_t uVar7;
  int local_6c;
  int i;
  uint32_t *extentInfo_pos;
  uint32_t *clipMark_pos;
  uint32_t *CPI_pos;
  uint32_t *programInfo_pos;
  uint32_t *sequenceInfo_pos;
  BitStreamWriter writer;
  int bufferSize_local;
  uint8_t *buffer_local;
  CLPIParser *this_local;
  
  writer.m_bitWrited = bufferSize;
  BitStreamWriter::BitStreamWriter((BitStreamWriter *)&sequenceInfo_pos);
  BitStreamWriter::setBuffer
            ((BitStreamWriter *)&sequenceInfo_pos,buffer,buffer + (int)writer.m_bitWrited);
  CLPIStreamInfo::writeString("HDMV",(BitStreamWriter *)&sequenceInfo_pos,4);
  CLPIStreamInfo::writeString(this->version_number,(BitStreamWriter *)&sequenceInfo_pos,4);
  iVar1 = BitStreamWriter::getBitsCount((BitStreamWriter *)&sequenceInfo_pos);
  BitStreamWriter::putBits((BitStreamWriter *)&sequenceInfo_pos,0x20,0);
  iVar2 = BitStreamWriter::getBitsCount((BitStreamWriter *)&sequenceInfo_pos);
  BitStreamWriter::putBits((BitStreamWriter *)&sequenceInfo_pos,0x20,0);
  iVar3 = BitStreamWriter::getBitsCount((BitStreamWriter *)&sequenceInfo_pos);
  BitStreamWriter::putBits((BitStreamWriter *)&sequenceInfo_pos,0x20,0);
  iVar4 = BitStreamWriter::getBitsCount((BitStreamWriter *)&sequenceInfo_pos);
  BitStreamWriter::putBits((BitStreamWriter *)&sequenceInfo_pos,0x20,0);
  iVar5 = BitStreamWriter::getBitsCount((BitStreamWriter *)&sequenceInfo_pos);
  BitStreamWriter::putBits((BitStreamWriter *)&sequenceInfo_pos,0x20,0);
  for (local_6c = 0; local_6c < 3; local_6c = local_6c + 1) {
    BitStreamWriter::putBits((BitStreamWriter *)&sequenceInfo_pos,0x20,0);
  }
  composeClipInfo(this,(BitStreamWriter *)&sequenceInfo_pos);
  while( true ) {
    iVar6 = BitStreamWriter::getBitsCount((BitStreamWriter *)&sequenceInfo_pos);
    if (iVar6 % 0x20 == 0) break;
    BitStreamWriter::putBits((BitStreamWriter *)&sequenceInfo_pos,8,0);
  }
  iVar6 = BitStreamWriter::getBitsCount((BitStreamWriter *)&sequenceInfo_pos);
  uVar7 = my_ntohl(iVar6 / 8);
  *(uint32_t *)(buffer + iVar1 / 8) = uVar7;
  composeSequenceInfo(this,(BitStreamWriter *)&sequenceInfo_pos);
  while( true ) {
    iVar1 = BitStreamWriter::getBitsCount((BitStreamWriter *)&sequenceInfo_pos);
    if (iVar1 % 0x20 == 0) break;
    BitStreamWriter::putBits((BitStreamWriter *)&sequenceInfo_pos,8,0);
  }
  iVar1 = BitStreamWriter::getBitsCount((BitStreamWriter *)&sequenceInfo_pos);
  uVar7 = my_ntohl(iVar1 / 8);
  *(uint32_t *)(buffer + iVar2 / 8) = uVar7;
  composeProgramInfo(this,(BitStreamWriter *)&sequenceInfo_pos,false);
  while( true ) {
    iVar1 = BitStreamWriter::getBitsCount((BitStreamWriter *)&sequenceInfo_pos);
    if (iVar1 % 0x20 == 0) break;
    BitStreamWriter::putBits((BitStreamWriter *)&sequenceInfo_pos,8,0);
  }
  iVar1 = BitStreamWriter::getBitsCount((BitStreamWriter *)&sequenceInfo_pos);
  uVar7 = my_ntohl(iVar1 / 8);
  *(uint32_t *)(buffer + iVar3 / 8) = uVar7;
  composeCPI(this,(BitStreamWriter *)&sequenceInfo_pos,false);
  while( true ) {
    iVar1 = BitStreamWriter::getBitsCount((BitStreamWriter *)&sequenceInfo_pos);
    if (iVar1 % 0x20 == 0) break;
    BitStreamWriter::putBits((BitStreamWriter *)&sequenceInfo_pos,8,0);
  }
  iVar1 = BitStreamWriter::getBitsCount((BitStreamWriter *)&sequenceInfo_pos);
  uVar7 = my_ntohl(iVar1 / 8);
  *(uint32_t *)(buffer + iVar4 / 8) = uVar7;
  composeClipMark((BitStreamWriter *)&sequenceInfo_pos);
  while( true ) {
    iVar1 = BitStreamWriter::getBitsCount((BitStreamWriter *)&sequenceInfo_pos);
    if (iVar1 % 0x20 == 0) break;
    BitStreamWriter::putBits((BitStreamWriter *)&sequenceInfo_pos,8,0);
  }
  iVar1 = BitStreamWriter::getBitsCount((BitStreamWriter *)&sequenceInfo_pos);
  uVar7 = my_ntohl(iVar1 / 8);
  *(uint32_t *)(buffer + iVar5 / 8) = uVar7;
  composeExtentInfo(this,(BitStreamWriter *)&sequenceInfo_pos);
  while( true ) {
    iVar1 = BitStreamWriter::getBitsCount((BitStreamWriter *)&sequenceInfo_pos);
    if (iVar1 % 0x20 == 0) break;
    BitStreamWriter::putBits((BitStreamWriter *)&sequenceInfo_pos,8,0);
  }
  BitStreamWriter::flushBits((BitStreamWriter *)&sequenceInfo_pos);
  iVar1 = BitStreamWriter::getBitsCount((BitStreamWriter *)&sequenceInfo_pos);
  return iVar1 / 8;
}

Assistant:

int CLPIParser::compose(uint8_t* buffer, const int bufferSize)
{
    BitStreamWriter writer{};
    writer.setBuffer(buffer, buffer + bufferSize);
    CLPIStreamInfo::writeString("HDMV", writer, 4);
    CLPIStreamInfo::writeString(version_number, writer, 4);
    const auto sequenceInfo_pos = reinterpret_cast<uint32_t*>(buffer + writer.getBitsCount() / 8);
    writer.putBits(32, 0);  // sequenceInfo_start_address
    const auto programInfo_pos = reinterpret_cast<uint32_t*>(buffer + writer.getBitsCount() / 8);
    writer.putBits(32, 0);  // programInfo_start_address
    const auto CPI_pos = reinterpret_cast<uint32_t*>(buffer + writer.getBitsCount() / 8);
    writer.putBits(32, 0);  // CPI start address
    const auto clipMark_pos = reinterpret_cast<uint32_t*>(buffer + writer.getBitsCount() / 8);
    writer.putBits(32, 0);  // clipMark
    const auto extentInfo_pos = reinterpret_cast<uint32_t*>(buffer + writer.getBitsCount() / 8);
    writer.putBits(32, 0);                              // extent info
    for (int i = 0; i < 3; i++) writer.putBits(32, 0);  // reserved_for_future_use

    composeClipInfo(writer);
    while (writer.getBitsCount() % 32 != 0) writer.putBits(8, 0);
    *sequenceInfo_pos = my_htonl(writer.getBitsCount() / 8);
    composeSequenceInfo(writer);
    while (writer.getBitsCount() % 32 != 0) writer.putBits(8, 0);

    *programInfo_pos = my_htonl(writer.getBitsCount() / 8);
    composeProgramInfo(writer, false);
    while (writer.getBitsCount() % 32 != 0) writer.putBits(8, 0);

    *CPI_pos = my_htonl(writer.getBitsCount() / 8);
    composeCPI(writer, false);
    while (writer.getBitsCount() % 32 != 0) writer.putBits(8, 0);

    *clipMark_pos = my_htonl(writer.getBitsCount() / 8);
    composeClipMark(writer);
    while (writer.getBitsCount() % 32 != 0) writer.putBits(8, 0);

    *extentInfo_pos = my_htonl(writer.getBitsCount() / 8);
    composeExtentInfo(writer);
    while (writer.getBitsCount() % 32 != 0) writer.putBits(8, 0);

    writer.flushBits();
    return writer.getBitsCount() / 8;
}